

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O3

vector<indk::Neuron_*,_std::allocator<indk::Neuron_*>_> * __thiscall
indk::NeuralNet::getEnsemble
          (vector<indk::Neuron_*,_std::allocator<indk::Neuron_*>_> *__return_storage_ptr__,
          NeuralNet *this,string *ename)

{
  pointer *pppNVar1;
  _Base_ptr p_Var2;
  iterator __position;
  Neuron *in_RAX;
  iterator iVar3;
  iterator iVar4;
  vector<indk::Neuron_*,_std::allocator<indk::Neuron_*>_> *neurons;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *en;
  _Base_ptr __k;
  Neuron *local_38;
  
  local_38 = in_RAX;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&(this->Ensembles)._M_t,ename);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->Ensembles)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __k = *(_Base_ptr *)(iVar3._M_node + 2);
    p_Var2 = iVar3._M_node[2]._M_parent;
    if (__k != p_Var2) {
      do {
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
                ::find(&(this->Neurons)._M_t,(key_type *)__k);
        if ((_Rb_tree_header *)iVar4._M_node == &(this->Neurons)._M_t._M_impl.super__Rb_tree_header)
        {
          local_38 = (Neuron *)0x0;
        }
        else {
          local_38 = *(Neuron **)(iVar4._M_node + 2);
        }
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<indk::Neuron*,std::allocator<indk::Neuron*>>::_M_realloc_insert<indk::Neuron*>
                    ((vector<indk::Neuron*,std::allocator<indk::Neuron*>> *)__return_storage_ptr__,
                     __position,&local_38);
        }
        else {
          *__position._M_current = local_38;
          pppNVar1 = &(__return_storage_ptr__->
                      super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
        __k = __k + 1;
      } while (__k != p_Var2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<indk::Neuron*> indk::NeuralNet::getEnsemble(const std::string& ename) {
    auto e = Ensembles.find(ename);
    if (e != Ensembles.end()) {
        std::vector<indk::Neuron*> neurons;
        for (const auto& en: e->second) {
            neurons.push_back(getNeuron(en));
        }
        return neurons;
    }
    return {};
}